

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O0

uint SRCTools::SincResampler::Utils::greatestCommonDivisor(uint a,uint b)

{
  uint uVar1;
  undefined4 local_10;
  uint r;
  uint b_local;
  uint a_local;
  
  local_10 = b;
  r = a;
  while (local_10 != 0) {
    uVar1 = r % local_10;
    r = local_10;
    local_10 = uVar1;
  }
  return r;
}

Assistant:

unsigned int Utils::greatestCommonDivisor(unsigned int a, unsigned int b) {
	while (0 < b) {
		unsigned int r = a % b;
		a = b;
		b = r;
	}
	return a;
}